

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O2

void __thiscall Assimp::ObjExporter::WriteMaterialFile(ObjExporter *this)

{
  ostringstream *out;
  string *psVar1;
  aiMaterial *pMat;
  aiReturn aVar2;
  ostream *poVar3;
  int iVar4;
  ulong uVar5;
  ai_real o;
  aiColor4D c;
  aiString s;
  
  out = &this->mOutputMat;
  WriteHeader(this,out);
  psVar1 = &this->endl;
  uVar5 = 0;
  do {
    if (this->pScene->mNumMaterials <= uVar5) {
      return;
    }
    pMat = this->pScene->mMaterials[uVar5];
    poVar3 = std::operator<<((ostream *)out,"newmtl ");
    GetMaterialName_abi_cxx11_((string *)&s,this,(uint)uVar5);
    poVar3 = std::operator<<(poVar3,(string *)&s);
    std::operator<<(poVar3,(string *)psVar1);
    std::__cxx11::string::~string((string *)&s);
    c.r = 0.0;
    c.g = 0.0;
    c.b = 0.0;
    c.a = 0.0;
    aVar2 = aiGetMaterialColor(pMat,"$clr.diffuse",0,0,&c);
    if (aVar2 == aiReturn_SUCCESS) {
      poVar3 = std::operator<<((ostream *)out,"Kd ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.r);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.g);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.b);
      std::operator<<(poVar3,(string *)psVar1);
    }
    aVar2 = aiGetMaterialColor(pMat,"$clr.ambient",0,0,&c);
    if (aVar2 == aiReturn_SUCCESS) {
      poVar3 = std::operator<<((ostream *)out,"Ka ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.r);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.g);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.b);
      std::operator<<(poVar3,(string *)psVar1);
    }
    aVar2 = aiGetMaterialColor(pMat,"$clr.specular",0,0,&c);
    if (aVar2 == aiReturn_SUCCESS) {
      poVar3 = std::operator<<((ostream *)out,"Ks ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.r);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.g);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.b);
      std::operator<<(poVar3,(string *)psVar1);
    }
    aVar2 = aiGetMaterialColor(pMat,"$clr.emissive",0,0,&c);
    if (aVar2 == aiReturn_SUCCESS) {
      poVar3 = std::operator<<((ostream *)out,"Ke ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.r);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.g);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.b);
      std::operator<<(poVar3,(string *)psVar1);
    }
    aVar2 = aiGetMaterialColor(pMat,"$clr.transparent",0,0,&c);
    if (aVar2 == aiReturn_SUCCESS) {
      poVar3 = std::operator<<((ostream *)out,"Tf ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.r);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.g);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,c.b);
      std::operator<<(poVar3,(string *)psVar1);
    }
    aVar2 = aiGetMaterialFloat(pMat,"$mat.opacity",0,0,&o);
    if (aVar2 == aiReturn_SUCCESS) {
      poVar3 = std::operator<<((ostream *)out,"d ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,o);
      std::operator<<(poVar3,(string *)psVar1);
    }
    aVar2 = aiGetMaterialFloat(pMat,"$mat.refracti",0,0,&o);
    if (aVar2 == aiReturn_SUCCESS) {
      poVar3 = std::operator<<((ostream *)out,"Ni ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,o);
      std::operator<<(poVar3,(string *)psVar1);
    }
    aVar2 = aiGetMaterialFloat(pMat,"$mat.shininess",0,0,&o);
    iVar4 = 1;
    if ((aVar2 == aiReturn_SUCCESS) && ((o != 0.0 || (NAN(o))))) {
      poVar3 = std::operator<<((ostream *)out,"Ns ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,o);
      std::operator<<(poVar3,(string *)psVar1);
      iVar4 = 2;
    }
    poVar3 = std::operator<<((ostream *)out,"illum ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
    std::operator<<(poVar3,(string *)psVar1);
    s.length = 0;
    s.data[0] = '\0';
    memset(s.data + 1,0x1b,0x3ff);
    aVar2 = aiGetMaterialString(pMat,"$tex.file",1,0,&s);
    if (aVar2 == aiReturn_SUCCESS) {
      poVar3 = std::operator<<((ostream *)out,"map_Kd ");
      poVar3 = std::operator<<(poVar3,s.data);
      std::operator<<(poVar3,(string *)psVar1);
    }
    aVar2 = aiGetMaterialString(pMat,"$tex.file",3,0,&s);
    if (aVar2 == aiReturn_SUCCESS) {
      poVar3 = std::operator<<((ostream *)out,"map_Ka ");
      poVar3 = std::operator<<(poVar3,s.data);
      std::operator<<(poVar3,(string *)psVar1);
    }
    aVar2 = aiGetMaterialString(pMat,"$tex.file",2,0,&s);
    if (aVar2 == aiReturn_SUCCESS) {
      poVar3 = std::operator<<((ostream *)out,"map_Ks ");
      poVar3 = std::operator<<(poVar3,s.data);
      std::operator<<(poVar3,(string *)psVar1);
    }
    aVar2 = aiGetMaterialString(pMat,"$tex.file",7,0,&s);
    if (aVar2 == aiReturn_SUCCESS) {
      poVar3 = std::operator<<((ostream *)out,"map_Ns ");
      poVar3 = std::operator<<(poVar3,s.data);
      std::operator<<(poVar3,(string *)psVar1);
    }
    aVar2 = aiGetMaterialString(pMat,"$tex.file",8,0,&s);
    if (aVar2 == aiReturn_SUCCESS) {
      poVar3 = std::operator<<((ostream *)out,"map_d ");
      poVar3 = std::operator<<(poVar3,s.data);
      std::operator<<(poVar3,(string *)psVar1);
    }
    aVar2 = aiGetMaterialString(pMat,"$tex.file",5,0,&s);
    if (aVar2 == aiReturn_SUCCESS) {
LAB_00339d35:
      poVar3 = std::operator<<((ostream *)out,"bump ");
      poVar3 = std::operator<<(poVar3,s.data);
      std::operator<<(poVar3,(string *)psVar1);
      poVar3 = std::operator<<((ostream *)out,"map_bump ");
      poVar3 = std::operator<<(poVar3,s.data);
      std::operator<<(poVar3,(string *)psVar1);
    }
    else {
      aVar2 = aiGetMaterialString(pMat,"$tex.file",6,0,&s);
      if (aVar2 == aiReturn_SUCCESS) goto LAB_00339d35;
    }
    std::operator<<((ostream *)out,(string *)psVar1);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void ObjExporter::WriteMaterialFile() {
    WriteHeader(mOutputMat);

    for(unsigned int i = 0; i < pScene->mNumMaterials; ++i) {
        const aiMaterial* const mat = pScene->mMaterials[i];

        int illum = 1;
        mOutputMat << "newmtl " << GetMaterialName(i)  << endl;

        aiColor4D c;
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_DIFFUSE,c)) {
            mOutputMat << "Kd " << c.r << " " << c.g << " " << c.b << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_AMBIENT,c)) {
            mOutputMat << "Ka " << c.r << " " << c.g << " " << c.b << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_SPECULAR,c)) {
            mOutputMat << "Ks " << c.r << " " << c.g << " " << c.b << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_EMISSIVE,c)) {
            mOutputMat << "Ke " << c.r << " " << c.g << " " << c.b << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_TRANSPARENT,c)) {
            mOutputMat << "Tf " << c.r << " " << c.g << " " << c.b << endl;
        }

        ai_real o;
        if(AI_SUCCESS == mat->Get(AI_MATKEY_OPACITY,o)) {
            mOutputMat << "d " << o << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_REFRACTI,o)) {
            mOutputMat << "Ni " << o << endl;
        }

        if(AI_SUCCESS == mat->Get(AI_MATKEY_SHININESS,o) && o) {
            mOutputMat << "Ns " << o << endl;
            illum = 2;
        }

        mOutputMat << "illum " << illum << endl;

        aiString s;
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_DIFFUSE(0),s)) {
            mOutputMat << "map_Kd " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_AMBIENT(0),s)) {
            mOutputMat << "map_Ka " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_SPECULAR(0),s)) {
            mOutputMat << "map_Ks " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_SHININESS(0),s)) {
            mOutputMat << "map_Ns " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_OPACITY(0),s)) {
            mOutputMat << "map_d " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_HEIGHT(0),s) || AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_NORMALS(0),s)) {
            // implementations seem to vary here, so write both variants
            mOutputMat << "bump " << s.data << endl;
            mOutputMat << "map_bump " << s.data << endl;
        }

        mOutputMat << endl;
    }
}